

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

bool __thiscall SVGChart::PPlot::DrawXAxis(PPlot *this,PRect *inRect,Painter *inPainter)

{
  PStyle *pPVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  float extraout_XMM0_Da;
  bool theIsMajorTick;
  float local_c8;
  float theX;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  PStyle *local_a0;
  string theLabel;
  PRect theTickRect;
  string theFormatString;
  
  pPVar1 = &(this->mXAxisSetup).mStyle;
  (*inPainter->_vptr_Painter[0xc])(inPainter,pPVar1);
  local_c8 = (float)inRect->mX;
  fVar12 = 0.0;
  if ((this->mXAxisSetup).mCrossOrigin == false) {
    if ((this->mYAxisSetup).mAscending == true) {
      fVar12 = (this->mYAxisSetup).mMax;
    }
    else {
      fVar12 = (this->mYAxisSetup).mMin;
    }
  }
  (*this->mYTrafo->_vptr_Trafo[2])(fVar12);
  fVar12 = extraout_XMM0_Da;
  (**inPainter->_vptr_Painter)
            (local_c8,extraout_XMM0_Da,(float)inRect->mW + local_c8,extraout_XMM0_Da,inPainter);
  local_c8 = fVar12;
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mXAxisSetup).mTickInfo.mStyle);
  iVar3 = (*this->mXTickIterator->_vptr_TickIterator[2])();
  if ((char)iVar3 == '\0') {
    bVar7 = false;
  }
  else {
    theFormatString._M_dataplus._M_p = (pointer)&theFormatString.field_2;
    theFormatString._M_string_length = 0;
    theFormatString.field_2._M_local_buf[0] = '\0';
    theTickRect.mW = 0;
    theTickRect.mH = 0;
    theTickRect.mX = 0;
    theTickRect.mY = 0;
    local_a8 = inRect->mY;
    local_b0 = inRect->mW;
    uVar11 = 0;
    lVar6 = inRect->mH;
    lVar9 = inRect->mX;
    local_a0 = pPVar1;
    if ((this->mXAxisSetup).mTickInfo.mTicksOn == true) {
      local_c0 = inRect->mH;
      local_b8 = inRect->mX;
      while( true ) {
        iVar3 = (*this->mXTickIterator->_vptr_TickIterator[3])
                          (this->mXTickIterator,&theX,&theIsMajorTick,&theFormatString);
        uVar10 = (uint)uVar11;
        if ((char)iVar3 == '\0') break;
        iVar3 = (*(this->super_PDrawer)._vptr_PDrawer[0xc])
                          (theX,this,(ulong)(uint)(int)local_c8,(ulong)theIsMajorTick,
                           &theFormatString,inPainter,&theTickRect);
        if ((char)iVar3 == '\0') {
          bVar7 = false;
          goto LAB_00105ce1;
        }
        uVar4 = (uint)(theTickRect.mH + theTickRect.mY);
        if (theTickRect.mH + theTickRect.mY <= (long)(int)uVar10) {
          uVar4 = uVar10;
        }
        uVar11 = (ulong)uVar4;
      }
      uVar11 = (ulong)(int)uVar10;
      lVar6 = local_c0;
      lVar9 = local_b8;
    }
    lVar2 = local_a8;
    lVar8 = uVar11 - local_a8;
    if ((long)uVar11 <= lVar6 + local_a8) {
      lVar8 = lVar6;
    }
    (*inPainter->_vptr_Painter[0xc])(inPainter,local_a0);
    std::__cxx11::string::string((string *)&theLabel,(string *)&(this->mXAxisSetup).mLabel);
    if (theLabel._M_string_length != 0) {
      iVar3 = (*inPainter->_vptr_Painter[8])(inPainter,theLabel._M_dataplus._M_p);
      iVar5 = (*inPainter->_vptr_Painter[9])(inPainter);
      (*inPainter->_vptr_Painter[10])
                (inPainter,(ulong)(uint)((int)lVar9 + (int)((local_b0 - iVar3) / 2)),
                 (ulong)(uint)(iVar5 + (int)lVar8 + (int)lVar2),theLabel._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&theLabel);
    bVar7 = true;
LAB_00105ce1:
    std::__cxx11::string::~string((string *)&theFormatString);
  }
  return bVar7;
}

Assistant:

bool PPlot::DrawXAxis (const PRect &inRect, Painter &inPainter) const {
      inPainter.SetStyle (mXAxisSetup.mStyle);

      float theX1 = inRect.mX;
      float theY1;
      float theTargetY = 0;
      if (!mXAxisSetup.mCrossOrigin) {
        if (mYAxisSetup.mAscending) {
          theTargetY = mYAxisSetup.mMax;
        } else {
          theTargetY = mYAxisSetup.mMin;
        }
      }
      theY1 = mYTrafo->Transform (theTargetY);

      // x-axis
      float theX2 = theX1+inRect.mW;
      float theY2 = theY1;
      inPainter.DrawLine (theX1, theY1, theX2, theY2);

      // ticks
      inPainter.SetStyle (mXAxisSetup.mTickInfo.mStyle);
      if (!mXTickIterator->Init ()) {
        return false;
      }

      float theX;
      bool theIsMajorTick;
      string theFormatString;

      int theYMax = 0;
      PRect theTickRect;
      PRect theRect = inRect;

      if (mXAxisSetup.mTickInfo.mTicksOn) {
          while (mXTickIterator->GetNextTick (theX, theIsMajorTick, theFormatString)) {
              if (!DrawXTick (theX, theY1, theIsMajorTick, theFormatString, inPainter, theTickRect)) {
                  return false;
              }
              
              if (theTickRect.mY+theTickRect.mH>theYMax) {
                  theYMax = theTickRect.mY+theTickRect.mH;
              }
          }
      }

      if (theYMax>theRect.mY+theRect.mH) {
        theRect.mH = theYMax-theRect.mY;
      }

      inPainter.SetStyle (mXAxisSetup.mStyle);
      string theLabel = mXAxisSetup.mLabel;
      if (theLabel.size ()>0) {
        int theW = inPainter.CalculateTextDrawSize (theLabel.c_str ());
        int theX = theRect.mX + (theRect.mW-theW)/2;
        int theY = theRect.mY+theRect.mH+inPainter.GetFontHeight ();
        inPainter.DrawText (theX, theY, theLabel.c_str ());
      }
      return true;
    }